

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O2

bool __thiscall SQArray::Insert(SQArray *this,SQInteger idx,SQObject *val)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQObjectPtr local_18;
  
  if ((idx < 0) || ((long)(this->_values)._size < idx)) {
    bVar2 = false;
  }
  else {
    local_18.super_SQObject._type = val->_type;
    local_18.super_SQObject._unVal = (SQObjectValue)(val->_unVal).pTable;
    if ((local_18.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    sqvector<SQObjectPtr>::insert(&this->_values,idx,&local_18);
    SQObjectPtr::~SQObjectPtr(&local_18);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Insert(SQInteger idx,const SQObject &val){
        if(idx < 0 || idx > (SQInteger)_values.size())
            return false;
        _values.insert(idx,val);
        return true;
    }